

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_help.c
# Opt level: O0

_Bool helpscan(uchar *buf,size_t len,scan_ctx *ctx)

{
  uchar uVar1;
  size_t sVar2;
  int iVar3;
  ulong local_30;
  size_t i;
  scan_ctx *ctx_local;
  size_t len_local;
  uchar *buf_local;
  
  local_30 = 0;
  do {
    if (len <= local_30) {
      return true;
    }
    if (ctx->show == '\0') {
      memmove(ctx->rbuf,ctx->rbuf + 1,ctx->tlen - 1);
      ctx->rbuf[ctx->tlen - 1] = buf[local_30];
      iVar3 = memcmp(ctx->rbuf,ctx->trigger,ctx->tlen);
      if (iVar3 == 0) {
        ctx->show = ctx->show + '\x01';
      }
    }
    else if (ctx->show == '\x01') {
      memmove(ctx->rbuf,ctx->rbuf + 1,ctx->flen - 1);
      ctx->rbuf[ctx->flen - 1] = buf[local_30];
      iVar3 = memcmp(ctx->rbuf,ctx->arg,ctx->flen);
      if (iVar3 == 0) {
        fputs(ctx->arg + 1,_stdout);
        ctx->show = ctx->show + '\x01';
      }
    }
    else {
      memmove(ctx->rbuf,ctx->rbuf + 1,ctx->elen - 1);
      ctx->rbuf[ctx->elen - 1] = buf[local_30];
      iVar3 = memcmp(ctx->rbuf,ctx->endarg,ctx->elen);
      if (iVar3 == 0) {
        return false;
      }
      if (buf[local_30] == '\n') {
        if (ctx->olen == 0xa0) {
          return false;
        }
        sVar2 = ctx->olen;
        ctx->olen = sVar2 + 1;
        ctx->obuf[sVar2] = '\0';
        ctx->olen = 0;
        puts(ctx->obuf);
      }
      else {
        if (ctx->olen == 0xa0) {
          return false;
        }
        uVar1 = buf[local_30];
        sVar2 = ctx->olen;
        ctx->olen = sVar2 + 1;
        ctx->obuf[sVar2] = uVar1;
      }
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

bool helpscan(const unsigned char *buf, size_t len, struct scan_ctx *ctx)
{
  size_t i;
  for(i = 0; i < len; i++) {
    if(!ctx->show) {
      /* wait for the trigger */
      memmove(&ctx->rbuf[0], &ctx->rbuf[1], ctx->tlen - 1);
      ctx->rbuf[ctx->tlen - 1] = buf[i];
      if(!memcmp(ctx->rbuf, ctx->trigger, ctx->tlen))
        ctx->show++;
      continue;
    }
    /* past the trigger */
    if(ctx->show == 1) {
      memmove(&ctx->rbuf[0], &ctx->rbuf[1], ctx->flen - 1);
      ctx->rbuf[ctx->flen - 1] = buf[i];
      if(!memcmp(ctx->rbuf, ctx->arg, ctx->flen)) {
        /* match, now output until endarg */
        fputs(&ctx->arg[1], stdout);
        ctx->show++;
      }
      continue;
    }
    /* show until the end */
    memmove(&ctx->rbuf[0], &ctx->rbuf[1], ctx->elen - 1);
    ctx->rbuf[ctx->elen - 1] = buf[i];
    if(!memcmp(ctx->rbuf, ctx->endarg, ctx->elen))
      return FALSE;

    if(buf[i] == '\n') {
      DEBUGASSERT(ctx->olen < sizeof(ctx->obuf));
      if(ctx->olen == sizeof(ctx->obuf))
        return FALSE; /* bail out */
      ctx->obuf[ctx->olen++] = 0;
      ctx->olen = 0;
      puts(ctx->obuf);
    }
    else {
      DEBUGASSERT(ctx->olen < sizeof(ctx->obuf));
      if(ctx->olen == sizeof(ctx->obuf))
        return FALSE; /* bail out */
      ctx->obuf[ctx->olen++] = buf[i];
    }
  }
  return TRUE;
}